

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O2

void aom_highbd_comp_mask_pred_avx2
               (uint8_t *comp_pred8,uint8_t *pred8,int width,int height,uint8_t *ref8,int ref_stride
               ,uint8_t *mask,int mask_stride,int invert_mask)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  __m256i s0;
  __m256i s0_00;
  __m256i s0_01;
  __m256i s0_02;
  __m256i s1;
  __m256i s1_00;
  __m256i s1_01;
  __m256i s1_02;
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  __m256i a_02;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  undefined8 *puVar6;
  int x;
  int iVar7;
  long lVar8;
  __m256i *palVar9;
  long lVar10;
  ulong *puVar11;
  undefined8 *puVar12;
  undefined8 *puVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  longlong lVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined1 in_stack_ffffffffffffff18 [12];
  int iVar25;
  __m256i *palVar26;
  undefined8 in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  longlong in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  undefined8 uVar27;
  longlong in_stack_ffffffffffffff70;
  longlong lVar28;
  undefined1 auVar23 [32];
  
  puVar12 = (undefined8 *)((long)comp_pred8 * 2);
  iVar7 = ref_stride;
  puVar6 = (undefined8 *)((long)ref8 * 2);
  iVar25 = width;
  puVar13 = (undefined8 *)((long)pred8 * 2);
  if (invert_mask == 0) {
    iVar7 = width;
    puVar6 = (undefined8 *)((long)pred8 * 2);
    iVar25 = ref_stride;
    puVar13 = (undefined8 *)((long)ref8 * 2);
  }
  palVar9 = (__m256i *)(long)iVar25;
  lVar10 = (long)iVar7;
  if (width == 8) {
    lVar8 = (long)(mask_stride * 2);
    lVar4 = (long)(iVar7 * 2) * 2;
    puVar11 = (ulong *)(mask + 8);
    iVar7 = 0;
    palVar26 = palVar9;
    do {
      uVar14 = *puVar13;
      uVar16 = puVar13[1];
      puVar6 = (undefined8 *)((long)puVar13 + (long)palVar26 * 2);
      uVar18 = *puVar6;
      uVar20 = puVar6[1];
      auVar24._8_8_ = 0;
      auVar24._0_8_ = *puVar11;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = puVar11[-1];
      auVar23._0_16_ = ZEXT116(0) * auVar24 + ZEXT116(1) * auVar22;
      auVar23._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar24;
      vpunpcklbw_avx2(auVar23,_DAT_00471d20);
      s0_00[1]._4_4_ = height;
      s0_00._0_12_ = in_stack_ffffffffffffff18;
      s0_00[2] = lVar10;
      s0_00[3] = (longlong)palVar26;
      s1_00[1] = in_stack_ffffffffffffff40;
      s1_00[0] = in_stack_ffffffffffffff38;
      s1_00[2] = lVar4;
      s1_00[3] = in_stack_ffffffffffffff50;
      a_00[1] = in_stack_ffffffffffffff60;
      a_00[0] = in_stack_ffffffffffffff58;
      a_00[2] = lVar8;
      a_00[3] = in_stack_ffffffffffffff70;
      highbd_comp_mask_pred_line_avx2(palVar9,s0_00,s1_00,a_00);
      *puVar12 = uVar14;
      puVar12[1] = uVar16;
      puVar12[2] = uVar18;
      puVar12[3] = uVar20;
      puVar12 = puVar12 + 4;
      iVar7 = iVar7 + 2;
      puVar13 = (undefined8 *)((long)puVar13 + (long)(iVar25 * 2) * 2);
      puVar11 = (ulong *)((long)puVar11 + lVar8);
    } while (iVar7 < height);
  }
  else {
    lVar4 = (long)mask_stride;
    if (width == 0x10) {
      lVar10 = lVar10 * 2;
      palVar9 = (__m256i *)((long)palVar9 * 2);
      iVar7 = 0;
      iVar25 = height;
      palVar26 = palVar9;
      do {
        uVar14 = *puVar13;
        uVar16 = puVar13[1];
        uVar18 = puVar13[2];
        uVar20 = puVar13[3];
        vpmovzxbw_avx2(*(undefined1 (*) [16])mask);
        s0[1]._4_4_ = iVar25;
        s0._0_12_ = in_stack_ffffffffffffff18;
        s0[2] = lVar10;
        s0[3] = (longlong)palVar26;
        s1[1] = in_stack_ffffffffffffff40;
        s1[0] = in_stack_ffffffffffffff38;
        s1[2] = lVar4;
        s1[3] = in_stack_ffffffffffffff50;
        a[1] = in_stack_ffffffffffffff60;
        a[0] = in_stack_ffffffffffffff58;
        a[2] = in_stack_ffffffffffffff68;
        a[3] = in_stack_ffffffffffffff70;
        highbd_comp_mask_pred_line_avx2(palVar9,s0,s1,a);
        *puVar12 = uVar14;
        puVar12[1] = uVar16;
        puVar12[2] = uVar18;
        puVar12[3] = uVar20;
        mask = *(undefined1 (*) [16])mask + lVar4;
        puVar12 = puVar12 + 4;
        iVar7 = iVar7 + 1;
        puVar13 = (undefined8 *)((long)puVar13 + (long)palVar26);
      } while (iVar7 < height);
    }
    else {
      lVar10 = lVar10 * 2;
      uVar5 = 0;
      palVar9 = (__m256i *)((long)palVar9 * 2);
      do {
        palVar26 = palVar9;
        for (lVar8 = 0; lVar8 < width; lVar8 = lVar8 + 0x20) {
          puVar1 = (undefined8 *)((long)puVar13 + lVar8 * 2);
          uVar14 = *puVar1;
          uVar16 = puVar1[1];
          uVar18 = puVar1[2];
          uVar20 = puVar1[3];
          puVar1 = (undefined8 *)((long)puVar13 + lVar8 * 2 + 0x20);
          uVar15 = *puVar1;
          lVar17 = puVar1[1];
          uVar19 = *(undefined8 *)*(undefined1 (*) [16])(puVar1 + 2);
          uVar21 = puVar1[3];
          puVar2 = (undefined8 *)((long)puVar6 + lVar8 * 2 + 0x20);
          uVar27 = *puVar2;
          lVar28 = puVar2[1];
          vpmovzxbw_avx2(*(undefined1 (*) [16])(mask + lVar8));
          vpmovzxbw_avx2(*(undefined1 (*) [16])(mask + lVar8 + 0x10));
          s0_01[1]._4_4_ = height;
          s0_01._0_12_ = in_stack_ffffffffffffff18;
          s0_01[2] = lVar10;
          s0_01[3] = (longlong)palVar26;
          s1_01[1] = uVar5;
          s1_01[0] = lVar4;
          s1_01[2] = uVar15;
          s1_01[3] = lVar17;
          a_01[2] = uVar27;
          a_01._0_16_ = *(undefined1 (*) [16])(puVar1 + 2);
          a_01[3] = lVar28;
          highbd_comp_mask_pred_line_avx2(palVar9,s0_01,s1_01,a_01);
          s0_02[1]._4_4_ = height;
          s0_02._0_12_ = in_stack_ffffffffffffff18;
          s0_02[2] = lVar10;
          s0_02[3] = (longlong)palVar26;
          s1_02[1] = uVar5;
          s1_02[0] = lVar4;
          s1_02[2] = uVar15;
          s1_02[3] = lVar17;
          a_02[1] = uVar21;
          a_02[0] = uVar19;
          a_02[2] = uVar27;
          a_02[3] = lVar28;
          highbd_comp_mask_pred_line_avx2(palVar9,s0_02,s1_02,a_02);
          *puVar12 = uVar14;
          puVar12[1] = uVar16;
          puVar12[2] = uVar18;
          puVar12[3] = uVar20;
          puVar12[4] = uVar15;
          puVar12[5] = lVar17;
          puVar12[6] = uVar19;
          puVar12[7] = uVar21;
          puVar12 = puVar12 + 8;
        }
        mask = mask + lVar4;
        uVar3 = (int)uVar5 + 1;
        uVar5 = (ulong)uVar3;
        puVar6 = (undefined8 *)((long)puVar6 + lVar10);
        puVar13 = (undefined8 *)((long)puVar13 + (long)palVar26);
        palVar9 = palVar26;
      } while ((int)uVar3 < height);
    }
  }
  return;
}

Assistant:

void aom_highbd_comp_mask_pred_avx2(uint8_t *comp_pred8, const uint8_t *pred8,
                                    int width, int height, const uint8_t *ref8,
                                    int ref_stride, const uint8_t *mask,
                                    int mask_stride, int invert_mask) {
  int i = 0;
  uint16_t *pred = CONVERT_TO_SHORTPTR(pred8);
  uint16_t *ref = CONVERT_TO_SHORTPTR(ref8);
  uint16_t *comp_pred = CONVERT_TO_SHORTPTR(comp_pred8);
  const uint16_t *src0 = invert_mask ? pred : ref;
  const uint16_t *src1 = invert_mask ? ref : pred;
  const int stride0 = invert_mask ? width : ref_stride;
  const int stride1 = invert_mask ? ref_stride : width;
  const __m256i zero = _mm256_setzero_si256();

  if (width == 8) {
    do {
      const __m256i s0 = mm256_loadu2_16(src0 + stride0, src0);
      const __m256i s1 = mm256_loadu2_16(src1 + stride1, src1);

      const __m128i m_l = _mm_loadl_epi64((const __m128i *)mask);
      const __m128i m_h = _mm_loadl_epi64((const __m128i *)(mask + 8));

      __m256i m = _mm256_castsi128_si256(m_l);
      m = _mm256_insertf128_si256(m, m_h, 1);
      const __m256i m_16 = _mm256_unpacklo_epi8(m, zero);

      const __m256i comp = highbd_comp_mask_pred_line_avx2(s0, s1, m_16);

      _mm_storeu_si128((__m128i *)(comp_pred), _mm256_castsi256_si128(comp));

      _mm_storeu_si128((__m128i *)(comp_pred + width),
                       _mm256_extractf128_si256(comp, 1));

      src0 += (stride0 << 1);
      src1 += (stride1 << 1);
      mask += (mask_stride << 1);
      comp_pred += (width << 1);
      i += 2;
    } while (i < height);
  } else if (width == 16) {
    do {
      const __m256i s0 = _mm256_loadu_si256((const __m256i *)(src0));
      const __m256i s1 = _mm256_loadu_si256((const __m256i *)(src1));
      const __m256i m_16 =
          _mm256_cvtepu8_epi16(_mm_loadu_si128((const __m128i *)mask));

      const __m256i comp = highbd_comp_mask_pred_line_avx2(s0, s1, m_16);

      _mm256_storeu_si256((__m256i *)comp_pred, comp);

      src0 += stride0;
      src1 += stride1;
      mask += mask_stride;
      comp_pred += width;
      i += 1;
    } while (i < height);
  } else {
    do {
      for (int x = 0; x < width; x += 32) {
        const __m256i s0 = _mm256_loadu_si256((const __m256i *)(src0 + x));
        const __m256i s2 = _mm256_loadu_si256((const __m256i *)(src0 + x + 16));
        const __m256i s1 = _mm256_loadu_si256((const __m256i *)(src1 + x));
        const __m256i s3 = _mm256_loadu_si256((const __m256i *)(src1 + x + 16));

        const __m256i m01_16 =
            _mm256_cvtepu8_epi16(_mm_loadu_si128((const __m128i *)(mask + x)));
        const __m256i m23_16 = _mm256_cvtepu8_epi16(
            _mm_loadu_si128((const __m128i *)(mask + x + 16)));

        const __m256i comp = highbd_comp_mask_pred_line_avx2(s0, s1, m01_16);
        const __m256i comp1 = highbd_comp_mask_pred_line_avx2(s2, s3, m23_16);

        _mm256_storeu_si256((__m256i *)comp_pred, comp);
        _mm256_storeu_si256((__m256i *)(comp_pred + 16), comp1);

        comp_pred += 32;
      }
      src0 += stride0;
      src1 += stride1;
      mask += mask_stride;
      i += 1;
    } while (i < height);
  }
}